

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StructDatePart::DeserializeFunction
          (Deserializer *deserializer,ScalarFunction *bound_function)

{
  BindData *this;
  vector<duckdb::DatePartSpecifier,_true> part_codes;
  LogicalType stype;
  type local_40;
  LogicalType local_28;
  
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2]
  )(bound_function,100,"stype");
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[6]
  )(bound_function);
  LogicalType::Deserialize(&local_28,(Deserializer *)bound_function);
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[7]
  )(bound_function);
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3]
  )(bound_function);
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2]
  )(bound_function,0x65,"part_codes");
  Deserializer::Read<duckdb::vector<duckdb::DatePartSpecifier,true>>
            (&local_40,(Deserializer *)bound_function);
  (*(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3]
  )(bound_function);
  this = (BindData *)operator_new(0x38);
  BindData::BindData(this,&local_28,&local_40);
  deserializer->_vptr_Deserializer = (_func_int **)this;
  if (local_40.super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
      super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                    .
                    super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  LogicalType::~LogicalType(&local_28);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> DeserializeFunction(Deserializer &deserializer, ScalarFunction &bound_function) {
		auto stype = deserializer.ReadProperty<LogicalType>(100, "stype");
		auto part_codes = deserializer.ReadProperty<vector<DatePartSpecifier>>(101, "part_codes");
		return make_uniq<BindData>(std::move(stype), std::move(part_codes));
	}